

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
wallet::coinselector_tests::KnapsackGroupOutputs
          (CoinsResult *available_coins,CWallet *wallet,CoinEligibilityFilter *filter)

{
  mapped_type *__x;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  FastRandomContext rand;
  allocator_type local_189;
  vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> local_188;
  CoinSelectionParams local_170;
  SelectionFilter local_118;
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  local_e8;
  FastRandomContext local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&local_b8,false);
  local_170.change_output_size = 0;
  local_170.change_spend_size = 0;
  local_170.m_min_change_target = 1000000;
  local_170.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  local_170.min_viable_change = 0;
  local_170.m_change_fee = 0;
  local_170.m_cost_of_change = 0;
  local_170.m_effective_feerate.nSatoshisPerK = 0;
  local_170.m_long_term_feerate.nSatoshisPerK = 0;
  local_170.m_discard_feerate.nSatoshisPerK._0_7_ = 0;
  local_170.m_discard_feerate.nSatoshisPerK._7_1_ = 0;
  local_170.tx_noinputs_size = 0;
  local_170.m_subtract_fee_outputs = false;
  local_170.m_avoid_partial_spends = false;
  local_170.m_include_unsafe_inputs = false;
  local_170.rng_fast = &local_b8;
  if (KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
      ::static_groups == '\0') {
    KnapsackGroupOutputs();
  }
  local_118.filter.conf_mine = filter->conf_mine;
  local_118.filter.conf_theirs = filter->conf_theirs;
  local_118.filter._17_8_ = *(undefined8 *)((long)&filter->max_descendants + 1);
  local_118.filter.max_descendants._0_1_ =
       (undefined1)((ulong)*(undefined8 *)((long)&filter->max_ancestors + 1) >> 0x38);
  local_118.filter.max_ancestors._0_1_ = (undefined1)filter->max_ancestors;
  local_118.filter.max_ancestors._1_7_ = (undefined7)(filter->max_ancestors >> 8);
  local_118.allow_mixed_output_types = true;
  __l._M_len = 1;
  __l._M_array = &local_118;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            (&local_188,__l,&local_189);
  GroupOutputs((FilteredOutputGroups *)&local_e8,wallet,available_coins,&local_170,&local_188);
  __x = std::
        map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
        ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                      *)&local_e8,filter);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
  ::operator=((_Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
               *)&KnapsackGroupOutputs::static_groups,
              (_Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::Groups>,_std::_Select1st<std::pair<const_OutputType,_wallet::Groups>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::Groups>_>_>
               *)__x);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator=
            (&KnapsackGroupOutputs::static_groups.all_groups.positive_group,
             &(__x->all_groups).positive_group);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator=
            (&KnapsackGroupOutputs::static_groups.all_groups.mixed_group,
             &(__x->all_groups).mixed_group);
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree(&local_e8);
  if (local_188.
      super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ChaCha20::~ChaCha20(&local_b8.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return &KnapsackGroupOutputs::static_groups.all_groups.mixed_group;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<OutputGroup>& KnapsackGroupOutputs(const CoinsResult& available_coins, CWallet& wallet, const CoinEligibilityFilter& filter)
{
    FastRandomContext rand{};
    CoinSelectionParams coin_selection_params{
        rand,
        /*change_output_size=*/ 0,
        /*change_spend_size=*/ 0,
        /*min_change_target=*/ CENT,
        /*effective_feerate=*/ CFeeRate(0),
        /*long_term_feerate=*/ CFeeRate(0),
        /*discard_feerate=*/ CFeeRate(0),
        /*tx_noinputs_size=*/ 0,
        /*avoid_partial=*/ false,
    };
    static OutputGroupTypeMap static_groups;
    static_groups = GroupOutputs(wallet, available_coins, coin_selection_params, {{filter}})[filter];
    return static_groups.all_groups.mixed_group;
}